

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

namespace_t * __thiscall cs_impl::any::get_ext(any *this)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  allocator local_31;
  string local_30;
  
  if (this->mDat != (proxy *)0x0) {
    iVar1 = (*this->mDat->data->_vptr_baseHolder[10])();
    return (namespace_t *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Type doesn\'t have extension field.",&local_31);
  cs::runtime_error::runtime_error(this_00,&local_30);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

cs::namespace_t &get_ext() const
		{
			if (this->mDat == nullptr)
				throw cs::runtime_error("Type doesn't have extension field.");
			return this->mDat->data->get_ext();
		}